

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindOperation.cpp
# Opt level: O2

CK_ULONG __thiscall
FindOperation::retrieveHandles(FindOperation *this,CK_OBJECT_HANDLE_PTR phObject,CK_ULONG ulCount)

{
  _Rb_tree_node_base *p_Var1;
  ulong uVar2;
  
  p_Var1 = (this->_handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (uVar2 = 0;
      ((_Rb_tree_header *)p_Var1 != &(this->_handles)._M_t._M_impl.super__Rb_tree_header &&
      (uVar2 < ulCount)); uVar2 = uVar2 + 1) {
    phObject[uVar2] = *(CK_OBJECT_HANDLE *)(p_Var1 + 1);
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
  }
  return uVar2;
}

Assistant:

CK_ULONG FindOperation::retrieveHandles(CK_OBJECT_HANDLE_PTR phObject, CK_ULONG ulCount)
{
    CK_ULONG ulReturn = 0;
    std::set<CK_OBJECT_HANDLE>::const_iterator it;
    for (it=_handles.begin(); it != _handles.end(); ++it) {
        if (ulReturn >= ulCount) break;

        phObject[ulReturn++] = *it;
    }
    return ulReturn;
}